

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switches.cpp
# Opt level: O1

maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> *
anon_unknown.dwarf_481d4::path_option
          (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           *__return_storage_ptr__,
          opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
          *path)

{
  pointer pcVar1;
  uint uVar2;
  
  uVar2 = pstore::command_line::option::get_num_occurrences(&path->super_option);
  if (uVar2 == 0) {
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 0x10) = 0;
    *(undefined8 *)__return_storage_ptr__ = 0;
    (__return_storage_ptr__->storage_).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 0x18) = 0;
  }
  else {
    __return_storage_ptr__->valid_ = true;
    (__return_storage_ptr__->storage_).__align =
         (anon_struct_8_0_00000001_for___align)((long)&__return_storage_ptr__->storage_ + 0x10);
    pcVar1 = (path->value_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->storage_,pcVar1,
               pcVar1 + (path->value_)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

pstore::maybe<std::string> path_option (opt<std::string> const & path) {
        if (path.get_num_occurrences () == 0U) {
            return pstore::nothing<std::string> ();
        }
        return pstore::just (path.get ());
    }